

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O3

bool tinyusdz::detail::is_supported_type(string *typeName)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = ::std::__cxx11::string::compare((char *)typeName);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)typeName);
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)typeName);
      if (iVar1 != 0) {
        iVar1 = ::std::__cxx11::string::compare((char *)typeName);
        if (iVar1 != 0) {
          iVar1 = ::std::__cxx11::string::compare((char *)typeName);
          if (iVar1 != 0) {
            iVar1 = ::std::__cxx11::string::compare((char *)typeName);
            if (iVar1 != 0) {
              iVar1 = ::std::__cxx11::string::compare((char *)typeName);
              if (iVar1 != 0) {
                iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                if (iVar1 != 0) {
                  iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                  if (iVar1 != 0) {
                    iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                    if (iVar1 != 0) {
                      iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                      if (iVar1 != 0) {
                        iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                        if (iVar1 != 0) {
                          iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                          if (iVar1 != 0) {
                            iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                            if (iVar1 != 0) {
                              iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                              if (iVar1 != 0) {
                                iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                                if (iVar1 != 0) {
                                  iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                                  if (iVar1 != 0) {
                                    iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                                    if (iVar1 != 0) {
                                      iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                                      if (iVar1 != 0) {
                                        iVar1 = ::std::__cxx11::string::compare((char *)typeName);
                                        bVar2 = iVar1 == 0;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool is_supported_type(const std::string &typeName) {
  if (typeName.compare("integer") == 0) return true;
  if (typeName.compare("boolean") == 0) return true;
  if (typeName.compare("float") == 0) return true;
  if (typeName.compare("color3") == 0) return true;
  if (typeName.compare("color4") == 0) return true;
  if (typeName.compare("vector2") == 0) return true;
  if (typeName.compare("vector3") == 0) return true;
  if (typeName.compare("vector4") == 0) return true;
  if (typeName.compare("matrix33") == 0) return true;
  if (typeName.compare("matrix44") == 0) return true;
  if (typeName.compare("string") == 0) return true;
  if (typeName.compare("filename") == 0) return true;

  if (typeName.compare("integerarray") == 0) return true;
  if (typeName.compare("floatarray") == 0) return true;
  if (typeName.compare("vector2array") == 0) return true;
  if (typeName.compare("vector3array") == 0) return true;
  if (typeName.compare("vector4array") == 0) return true;
  if (typeName.compare("color3array") == 0) return true;
  if (typeName.compare("color4array") == 0) return true;
  if (typeName.compare("stringarray") == 0) return true;

  // No matrixarray

  // TODO
  // if (typeName.compare("color") == 0) return true;
  // if (typeName.compare("geomname") == 0) return true;
  // if (typeName.compare("geomnamearray") == 0) return true;

  return false;
}